

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_GetGamma_Test<pica::Particle<(pica::Dimension)2>_>::TestBody
          (ParticleTest_GetGamma_Test<pica::Particle<(pica::Dimension)2>_> *this)

{
  bool bVar1;
  Particle<(pica::Dimension)2> *pPVar2;
  long in_RDI;
  Particle<(pica::Dimension)2> *this_00;
  char *file;
  MassType MVar3;
  double extraout_XMM0_Qa;
  FP FVar4;
  AssertHelper *this_01;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  GammaType expectedGamma;
  ParticleType particle;
  AssertHelper *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff10;
  int line;
  Type TVar5;
  Particle<(pica::Dimension)2> *in_stack_ffffffffffffff30;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *in_stack_ffffffffffffff40;
  AssertionResult local_b8;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  AssertHelper *in_stack_ffffffffffffff60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  Particle<(pica::Dimension)2> local_48;
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
            (in_stack_ffffffffffffff40);
  pPVar2 = &local_48;
  pica::Particle<(pica::Dimension)2>::getMomentum(in_stack_ffffffffffffff30);
  file = (char *)pica::Vector3<double>::norm2((Vector3<double> *)&stack0xffffffffffffff98);
  this_00 = &local_48;
  MVar3 = pica::Particle<(pica::Dimension)2>::getMass(this_00);
  pica::Constants<double>::c(this_00,pPVar2);
  FVar4 = pica::sqr(MVar3 * extraout_XMM0_Qa);
  line = (int)((ulong)MVar3 >> 0x20);
  this_01 = (AssertHelper *)sqrt((double)file / FVar4 + 1.0);
  *(undefined8 *)(in_RDI + 0x18) = 0x3d719799812dea11;
  if (ABS((double)this_01) < *(double *)(in_RDI + 0x10) ||
      ABS((double)this_01) == *(double *)(in_RDI + 0x10)) {
    pica::Particle<(pica::Dimension)2>::getGamma(&local_48);
    TVar5 = (Type)((ulong)in_RDI >> 0x20);
    testing::internal::CmpHelperLE<double,double>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (double *)in_stack_ffffffffffffff90.ptr_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff30);
      testing::AssertionResult::failure_message((AssertionResult *)0x2036b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_ffffffffffffff30,TVar5,file,line,in_stack_ffffffffffffff10
                );
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff60,
                 (Message *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      testing::internal::AssertHelper::~AssertHelper(this_01);
      testing::Message::~Message((Message *)0x2036fc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x20375c);
  }
  else {
    pica::Particle<(pica::Dimension)2>::getGamma(&local_48);
    TVar5 = (Type)((ulong)in_RDI >> 0x20);
    testing::internal::CmpHelperLE<double,double>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (double *)in_stack_ffffffffffffff90.ptr_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff88);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff30);
      testing::AssertionResult::failure_message((AssertionResult *)0x203545);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_ffffffffffffff30,TVar5,file,line,(char *)this_01);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff60,
                 (Message *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff00);
      testing::Message::~Message((Message *)0x203599);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2035ff);
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetGamma)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;

    ParticleType particle = this->randomParticle();
    GammaType expectedGamma = sqrt(static_cast<GammaType>(1.0) + particle.getMomentum().norm2() /
        sqr(particle.getMass() * Constants<GammaType>::c()));
    this->maxRelativeError = 1e-12;
    ASSERT_NEAR_FP(expectedGamma, particle.getGamma());
}